

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linde_buzo_gray_algorithm.cc
# Opt level: O2

bool __thiscall
sptk::LindeBuzoGrayAlgorithm::Run
          (LindeBuzoGrayAlgorithm *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *codebook_vectors,vector<int,_std::allocator<int>_> *codebook_indices,
          double *total_distance)

{
  pointer pvVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  StatisticsAccumulation *this_00;
  int iVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  undefined4 uVar9;
  int t;
  long lVar10;
  vector<double,_std::allocator<double>_> *this_01;
  ulong uVar11;
  size_type __new_size;
  int i_1;
  uint uVar12;
  int iVar13;
  int m;
  long lVar14;
  long lVar15;
  double dVar16;
  int index;
  double random_value;
  StatisticsAccumulation *local_100;
  ulong local_f8;
  int local_ec;
  double *local_e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_e0;
  double local_d8;
  int local_cc;
  double local_c8;
  undefined8 uStack_c0;
  ulong local_b0;
  vector<int,_std::allocator<int>_> *local_a8;
  VectorQuantization *local_a0;
  ulong local_98;
  vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
  buffers;
  NormalDistributedRandomValueGeneration random_value_generation;
  
  uVar8 = ((long)(input_vectors->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(input_vectors->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (this->is_valid_ == true) {
    if (total_distance == (double *)0x0) {
      return false;
    }
    if (codebook_indices == (vector<int,_std::allocator<int>_> *)0x0) {
      return false;
    }
    if (codebook_vectors ==
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0) {
      return false;
    }
    iVar13 = this->target_codebook_size_;
    local_f8._0_4_ = (int)uVar8;
    iVar5 = (int)local_f8;
    if ((int)local_f8 < this->min_num_vector_in_cluster_ * iVar13) {
      return false;
    }
    if (((long)(codebook_vectors->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(codebook_vectors->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x18 ==
        (long)this->initial_codebook_size_) {
      __new_size = (size_type)(int)local_f8;
      local_f8 = uVar8;
      if ((long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2 != __new_size) {
        std::vector<int,_std::allocator<int>_>::resize(codebook_indices,__new_size);
        iVar13 = this->target_codebook_size_;
      }
      local_e0 = input_vectors;
      local_a8 = codebook_indices;
      std::
      vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
      ::vector(&buffers,(long)iVar13,(allocator_type *)&random_value_generation);
      NormalDistributedRandomValueGeneration::NormalDistributedRandomValueGeneration
                (&random_value_generation,this->seed_);
      *total_distance = 1.79769313486232e+308;
      local_100 = &this->statistics_accumulation_;
      local_a0 = &this->vector_quantization_;
      local_98 = 0;
      if (0 < iVar5) {
        local_98 = uVar8 & 0xffffffff;
      }
      uVar12 = this->initial_codebook_size_;
LAB_0010f5c4:
      uVar4 = uVar12 * 2;
      if ((int)uVar4 <= this->target_codebook_size_) {
        local_e8 = total_distance;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(codebook_vectors,(long)(int)uVar4);
        for (this_01 = (codebook_vectors->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + (int)uVar12;
            this_01 !=
            (codebook_vectors->
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
          std::vector<double,_std::allocator<double>_>::resize(this_01,(long)this->num_order_ + 1);
        }
        uVar3 = uVar12;
        if ((int)uVar12 < 1) {
          uVar3 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
          for (lVar14 = 0; lVar14 <= this->num_order_; lVar14 = lVar14 + 1) {
            bVar6 = NormalDistributedRandomValueGeneration::Get
                              (&random_value_generation,&random_value);
            if (!bVar6) goto LAB_0010f986;
            dVar16 = this->splitting_factor_ *
                     (double)CONCAT44(random_value._4_4_,random_value._0_4_);
            pvVar1 = (codebook_vectors->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar10 = *(long *)&pvVar1[uVar8].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            *(double *)
             (*(long *)&pvVar1[uVar8 + (long)(int)uVar12].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + lVar14 * 8) =
                 *(double *)(lVar10 + lVar14 * 8) - dVar16;
            *(double *)(lVar10 + lVar14 * 8) = dVar16 + *(double *)(lVar10 + lVar14 * 8);
          }
        }
        iVar13 = 0;
        local_b0 = 0;
        if (0 < (int)uVar4) {
          local_b0 = (ulong)uVar4;
        }
        lVar14 = local_b0 * 0x80;
        local_c8 = 1.79769313486232e+308;
        while (this_00 = local_100, uStack_c0 = 0, uVar8 = local_f8, total_distance = local_e8,
              uVar12 = uVar4, iVar13 < this->num_iteration_) {
          for (lVar10 = 0; lVar14 != lVar10; lVar10 = lVar10 + 0x80) {
            StatisticsAccumulation::Clear
                      (this_00,(Buffer *)
                               ((long)&(buffers.
                                        super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_vptr_Buffer +
                               lVar10));
          }
          dVar16 = 0.0;
          lVar10 = 0;
          local_cc = iVar13;
          for (uVar8 = 0; local_98 != uVar8; uVar8 = uVar8 + 1) {
            local_d8 = dVar16;
            bVar6 = VectorQuantization::Run
                              (local_a0,(vector<double,_std::allocator<double>_> *)
                                        ((long)&(((local_e0->
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                super__Vector_base<double,_std::allocator<double>_>)
                                                ._M_impl.super__Vector_impl_data + lVar10),
                               codebook_vectors,&index);
            if (!bVar6) goto LAB_0010f986;
            (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar8] = index;
            bVar6 = StatisticsAccumulation::Run
                              (local_100,
                               (vector<double,_std::allocator<double>_> *)
                               ((long)&(((local_e0->
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar10),
                               buffers.
                               super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                               ._M_impl.super__Vector_impl_data._M_start + index);
            if ((!bVar6) ||
               (bVar6 = DistanceCalculation::Run
                                  (&this->distance_calculation_,
                                   (vector<double,_std::allocator<double>_> *)
                                   ((long)&(((local_e0->
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data + lVar10),
                                   (codebook_vectors->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + index,&random_value)
               , !bVar6)) goto LAB_0010f986;
            dVar16 = local_d8 + (double)CONCAT44(random_value._4_4_,random_value._0_4_);
            lVar10 = lVar10 + 0x18;
          }
          dVar16 = dVar16 / (double)iVar5;
          *local_e8 = dVar16;
          uVar8 = local_f8;
          total_distance = local_e8;
          if (((dVar16 == 0.0) && (!NAN(dVar16))) ||
             (local_d8 = dVar16, ABS(local_c8 - dVar16) / dVar16 < this->convergence_threshold_))
          break;
          lVar15 = 0;
          lVar10 = 0;
          local_c8 = (double)CONCAT44(local_c8._4_4_,0xffffffff);
          local_ec = 0;
          for (uVar8 = 0; local_b0 != uVar8; uVar8 = uVar8 + 1) {
            bVar6 = StatisticsAccumulation::GetNumData
                              (local_100,
                               (Buffer *)
                               ((long)&(buffers.
                                        super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_vptr_Buffer +
                               lVar10),(int *)&random_value);
            if (!bVar6) goto LAB_0010f986;
            uVar9 = local_c8._0_4_;
            if (local_ec < random_value._0_4_) {
              uVar9 = (undefined4)uVar8;
            }
            local_c8 = (double)CONCAT44(local_c8._4_4_,uVar9);
            if (local_ec <= random_value._0_4_) {
              local_ec = random_value._0_4_;
            }
            if ((this->min_num_vector_in_cluster_ <= random_value._0_4_) &&
               (bVar6 = StatisticsAccumulation::GetMean
                                  (local_100,
                                   (Buffer *)
                                   ((long)&(buffers.
                                            super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_vptr_Buffer
                                   + lVar10),
                                   (vector<double,_std::allocator<double>_> *)
                                   ((long)&(((codebook_vectors->
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data + lVar15)), !bVar6))
            goto LAB_0010f986;
            lVar10 = lVar10 + 0x80;
            lVar15 = lVar15 + 0x18;
          }
          lVar10 = (long)local_c8._0_4_;
          for (uVar8 = 0; uVar8 != local_b0; uVar8 = uVar8 + 1) {
            bVar6 = StatisticsAccumulation::GetNumData
                              (local_100,
                               buffers.
                               super__Vector_base<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar8,&index);
            if (!bVar6) goto LAB_0010f986;
            if (index < this->min_num_vector_in_cluster_) {
              for (lVar15 = 0; lVar15 <= this->num_order_; lVar15 = lVar15 + 1) {
                bVar6 = NormalDistributedRandomValueGeneration::Get
                                  (&random_value_generation,&random_value);
                if (!bVar6) goto LAB_0010f986;
                dVar16 = this->splitting_factor_ *
                         (double)CONCAT44(random_value._4_4_,random_value._0_4_);
                pvVar1 = (codebook_vectors->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                lVar2 = *(long *)&pvVar1[lVar10].super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data;
                *(double *)
                 (*(long *)&pvVar1[uVar8].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + lVar15 * 8) =
                     *(double *)(lVar2 + lVar15 * 8) - dVar16;
                *(double *)(lVar2 + lVar15 * 8) = dVar16 + *(double *)(lVar2 + lVar15 * 8);
              }
            }
          }
          local_c8 = local_d8;
          iVar13 = local_cc + 1;
        }
        goto LAB_0010f5c4;
      }
      lVar10 = 0;
      lVar14 = 0;
      uVar11 = 0;
      bVar6 = false;
      do {
        if (local_98 == uVar11) {
          bVar6 = (long)(int)uVar8 <= (long)uVar11;
          break;
        }
        bVar7 = VectorQuantization::Run
                          (local_a0,(vector<double,_std::allocator<double>_> *)
                                    ((long)&(((local_e0->
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data + lVar14),
                           codebook_vectors,
                           (int *)((long)(local_a8->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_start + lVar10));
        uVar11 = uVar11 + 1;
        lVar14 = lVar14 + 0x18;
        lVar10 = lVar10 + 4;
      } while (bVar7);
LAB_0010f988:
      std::
      vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
      ::~vector(&buffers);
      return bVar6;
    }
  }
  return false;
LAB_0010f986:
  bVar6 = false;
  goto LAB_0010f988;
}

Assistant:

bool LindeBuzoGrayAlgorithm::Run(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<std::vector<double> >* codebook_vectors,
    std::vector<int>* codebook_indices, double* total_distance) const {
  // Check inputs.
  const int num_input_vector(static_cast<int>(input_vectors.size()));
  if (!is_valid_ ||
      num_input_vector < min_num_vector_in_cluster_ * target_codebook_size_ ||
      NULL == codebook_vectors || NULL == codebook_indices ||
      NULL == total_distance ||
      codebook_vectors->size() !=
          static_cast<std::size_t>(initial_codebook_size_)) {
    return false;
  }

  // Prepare memories.
  if (codebook_indices->size() != static_cast<std::size_t>(num_input_vector)) {
    codebook_indices->resize(num_input_vector);
  }
  std::vector<StatisticsAccumulation::Buffer> buffers(target_codebook_size_);

  // Prepare random value generator.
  NormalDistributedRandomValueGeneration random_value_generation(seed_);

  *total_distance = sptk::kMax;

  // Design codebook.
  int current_codebook_size(initial_codebook_size_);
  for (int next_codebook_size(current_codebook_size * 2);
       next_codebook_size <= target_codebook_size_; next_codebook_size *= 2) {
    // Double codebook size.
    codebook_vectors->resize(next_codebook_size);
    for (std::vector<std::vector<double> >::iterator itr(
             codebook_vectors->begin() + current_codebook_size);
         itr != codebook_vectors->end(); ++itr) {
      itr->resize(num_order_ + 1);
    }

    // Perturb codebook vectors.
    for (int i(0); i < current_codebook_size; ++i) {
      for (int m(0); m <= num_order_; ++m) {
        double random_value;
        if (!random_value_generation.Get(&random_value)) {
          return false;
        }
        const double perturbation(splitting_factor_ * random_value);
        const int j(i + current_codebook_size);
        (*codebook_vectors)[j][m] = (*codebook_vectors)[i][m] - perturbation;
        (*codebook_vectors)[i][m] = (*codebook_vectors)[i][m] + perturbation;
      }
    }

    current_codebook_size = next_codebook_size;

    double prev_total_distance(sptk::kMax);
    for (int n(0); n < num_iteration_; ++n) {
      // Initialize.
      double sum(0.0);
      for (int i(0); i < current_codebook_size; ++i) {
        statistics_accumulation_.Clear(&(buffers[i]));
      }

      // Accumulate statistics (E-step).
      for (int t(0); t < num_input_vector; ++t) {
        int index;
        if (!vector_quantization_.Run(input_vectors[t], *codebook_vectors,
                                      &index)) {
          return false;
        }
        (*codebook_indices)[t] = index;

        if (!statistics_accumulation_.Run(input_vectors[t],
                                          &(buffers[index]))) {
          return false;
        }

        double distance;
        if (!distance_calculation_.Run(input_vectors[t],
                                       (*codebook_vectors)[index], &distance)) {
          return false;
        }
        sum += distance;
      }
      *total_distance = sum / num_input_vector;

      // Check convergence.
      const double criterion_value(
          std::fabs(prev_total_distance - *total_distance) / *total_distance);
      if (0.0 == *total_distance || criterion_value < convergence_threshold_) {
        break;
      }
      prev_total_distance = *total_distance;

      // Update codebook (M-step) and find a maximum cluster.
      int majority_index(-1);
      int max_num_vector_in_cluster(0);
      for (int i(0); i < current_codebook_size; ++i) {
        int num_vector;
        if (!statistics_accumulation_.GetNumData(buffers[i], &num_vector)) {
          return false;
        }

        if (max_num_vector_in_cluster < num_vector) {
          majority_index = i;
          max_num_vector_in_cluster = num_vector;
        }

        // Update if the cluster contains enough data.
        if (min_num_vector_in_cluster_ <= num_vector) {
          if (!statistics_accumulation_.GetMean(buffers[i],
                                                &((*codebook_vectors)[i]))) {
            return false;
          }
        }
      }

      // Update the remaining centroids.
      for (int i(0); i < current_codebook_size; ++i) {
        int num_vector;
        if (!statistics_accumulation_.GetNumData(buffers[i], &num_vector)) {
          return false;
        }

        if (num_vector < min_num_vector_in_cluster_) {
          for (int m(0); m <= num_order_; ++m) {
            double random_value;
            if (!random_value_generation.Get(&random_value)) {
              return false;
            }
            const double perturbation(splitting_factor_ * random_value);
            const int j(majority_index);
            (*codebook_vectors)[i][m] =
                (*codebook_vectors)[j][m] - perturbation;
            (*codebook_vectors)[j][m] =
                (*codebook_vectors)[j][m] + perturbation;
          }
        }
      }
    }
  }

  // Save final results.
  for (int t(0); t < num_input_vector; ++t) {
    if (!vector_quantization_.Run(input_vectors[t], *codebook_vectors,
                                  &((*codebook_indices)[t]))) {
      return false;
    }
  }

  return true;
}